

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O2

void amrex::Multiply<amrex::FArrayBox,void>
               (FabArray<amrex::FArrayBox> *dst,FabArray<amrex::FArrayBox> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Box local_19c;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  FabArray<amrex::FArrayBox> *local_160;
  FabArray<amrex::FArrayBox> *local_158;
  IntVect *local_150;
  ulong local_148;
  long local_140;
  long local_138;
  long local_130;
  ulong local_128;
  long local_120;
  long local_118;
  Array4<double> dstFab;
  Array4<const_double> srcFab;
  MFIter mfi;
  
  uVar1 = (ulong)(uint)numcomp;
  local_160 = dst;
  local_158 = src;
  local_150 = nghost;
  MFIter::MFIter(&mfi,&dst->super_FabArrayBase,true);
  if (numcomp < 1) {
    uVar1 = 0;
  }
  local_170 = (long)srccomp << 3;
  local_168 = (long)dstcomp << 3;
  local_148 = uVar1;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_19c,&mfi,local_150);
    if ((((local_19c.smallend.vect[0] <= local_19c.bigend.vect[0]) &&
         (local_19c.smallend.vect[1] <= local_19c.bigend.vect[1])) &&
        (local_19c.smallend.vect[2] <= local_19c.bigend.vect[2])) && (local_19c.btype.itype < 8)) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&srcFab,local_158,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&dstFab,local_160,&mfi);
      local_130 = (long)local_19c.smallend.vect[1];
      local_140 = (long)local_19c.smallend.vect[2];
      local_138 = (long)local_19c.smallend.vect[0] * 8;
      local_178 = local_168;
      local_180 = local_170;
      for (local_128 = 0; lVar4 = local_140, local_128 != local_148; local_128 = local_128 + 1) {
        for (; (int)lVar4 <= local_19c.bigend.vect[2]; lVar4 = lVar4 + 1) {
          local_118 = (long)dstFab.begin.x;
          local_120 = (long)dstFab.begin.y;
          lVar6 = (long)srcFab.p +
                  srcFab.nstride * local_180 +
                  (local_130 - srcFab.begin.y) * srcFab.jstride * 8 +
                  (lVar4 - srcFab.begin.z) * srcFab.kstride * 8 + (long)srcFab.begin.x * -8 +
                  local_138;
          lVar2 = (long)dstFab.p +
                  dstFab.nstride * local_178 +
                  (local_130 - local_120) * dstFab.jstride * 8 +
                  (lVar4 - dstFab.begin.z) * dstFab.kstride * 8 + local_118 * -8 + local_138;
          for (lVar5 = local_130; lVar5 <= local_19c.bigend.vect[1]; lVar5 = lVar5 + 1) {
            if (local_19c.smallend.vect[0] <= local_19c.bigend.vect[0]) {
              lVar3 = 0;
              do {
                *(double *)(lVar2 + lVar3 * 8) =
                     *(double *)(lVar6 + lVar3 * 8) * *(double *)(lVar2 + lVar3 * 8);
                lVar3 = lVar3 + 1;
              } while ((local_19c.bigend.vect[0] - local_19c.smallend.vect[0]) + 1 != (int)lVar3);
            }
            lVar6 = lVar6 + srcFab.jstride * 8;
            lVar2 = lVar2 + dstFab.jstride * 8;
          }
        }
        local_180 = local_180 + 8;
        local_178 = local_178 + 8;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
Multiply (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) *= srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) *= srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}